

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::split(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
        *this,int insert_position,
       btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
       *dest,allocator_type *alloc)

{
  field_type fVar1;
  field_type fVar2;
  byte bVar3;
  bool bVar4;
  template_ElementType<1UL> *ptVar5;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *pbVar6;
  BaseCountedInstance *x;
  BaseCountedInstance *this_00;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *c;
  allocator_type *alloc_00;
  allocator_type *extraout_RDX;
  allocator_type *alloc_01;
  allocator_type *extraout_RDX_00;
  allocator_type *alloc_02;
  int iVar7;
  byte bVar8;
  allocator_type *in_R9;
  ulong uVar9;
  size_type i;
  ulong i_00;
  allocator_type local_40;
  allocator_type local_38;
  
  fVar1 = count(dest);
  if (fVar1 != '\0') {
    __assert_fail("dest->count() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8fb,
                  "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>]"
                 );
  }
  fVar1 = max_count(this);
  if (fVar1 == '\x0f') {
    if (insert_position == 0xf) {
      bVar8 = 0;
    }
    else if (insert_position == 0) {
      fVar1 = count(this);
      bVar8 = fVar1 - 1;
    }
    else {
      bVar8 = count(this);
      bVar8 = bVar8 >> 1;
    }
    ptVar5 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
             ::GetField<1ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
                              *)dest);
    ptVar5[2] = bVar8;
    fVar1 = count(this);
    fVar2 = count(dest);
    ptVar5 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
             ::GetField<1ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
                              *)this);
    ptVar5[2] = fVar1 - fVar2;
    fVar1 = count(this);
    if (fVar1 != '\0') {
      bVar8 = count(dest);
      bVar3 = count(this);
      alloc_00 = (allocator_type *)0x0;
      uninitialized_move_n(this,(ulong)bVar8,(ulong)bVar3,0,dest,in_R9);
      bVar8 = count(this);
      bVar3 = count(dest);
      value_destroy_n(this,(ulong)bVar8,(ulong)bVar3,alloc_00);
      fVar1 = count(this);
      ptVar5 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
               ::GetField<1ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
                                *)this);
      ptVar5[2] = fVar1 + 0xff;
      pbVar6 = parent(this);
      bVar8 = position(this);
      bVar3 = count(this);
      local_40.super_CountingAllocator<phmap::test_internal::MovableOnlyInstance>.bytes_used_ =
           (CountingAllocator<phmap::test_internal::MovableOnlyInstance>)slot(this,(ulong)bVar3);
      bVar3 = count(pbVar6);
      if (bVar3 < bVar8) {
        __assert_fail("i <= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x852,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>, Args = <phmap::test_internal::MovableOnlyInstance *>]"
                     );
      }
      uVar9 = (ulong)bVar8;
      bVar3 = count(pbVar6);
      if (bVar8 < bVar3) {
        bVar8 = count(pbVar6);
        bVar3 = count(pbVar6);
        local_38.super_CountingAllocator<phmap::test_internal::MovableOnlyInstance>.bytes_used_ =
             (CountingAllocator<phmap::test_internal::MovableOnlyInstance>)
             slot(pbVar6,(ulong)bVar3 - 1);
        btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
        ::value_init<phmap::test_internal::MovableOnlyInstance*>
                  ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
                    *)pbVar6,(ulong)bVar8,&local_38,(MovableOnlyInstance **)alloc_00);
        bVar8 = count(pbVar6);
        alloc_01 = extraout_RDX;
        for (i = (ulong)bVar8 - 2; uVar9 < i + 1; i = i - 1) {
          x = &slot(pbVar6,i)->super_BaseCountedInstance;
          this_00 = &slot(pbVar6,i + 1)->super_BaseCountedInstance;
          test_internal::BaseCountedInstance::operator=(this_00,x);
          alloc_01 = extraout_RDX_00;
        }
        value_destroy(pbVar6,uVar9,alloc_01);
      }
      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
      ::value_init<phmap::test_internal::MovableOnlyInstance*>
                ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
                  *)pbVar6,uVar9,&local_40,(MovableOnlyInstance **)alloc_00);
      fVar1 = count(pbVar6);
      ptVar5 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
               ::GetField<1ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>
                                *)pbVar6);
      ptVar5[2] = fVar1 + '\x01';
      bVar4 = leaf(pbVar6);
      if (!bVar4) {
        bVar8 = count(pbVar6);
        uVar9 = uVar9 + 1;
        if (uVar9 < bVar8) {
          bVar8 = count(pbVar6);
          i_00 = (ulong)bVar8;
          while ((long)uVar9 < (long)i_00) {
            c = child(pbVar6,i_00 - 1);
            set_child(pbVar6,i_00,c);
            i_00 = i_00 - 1;
          }
          mutable_child(pbVar6,uVar9);
        }
      }
      bVar8 = count(this);
      value_destroy(this,(ulong)bVar8,alloc_02);
      pbVar6 = parent(this);
      bVar8 = position(this);
      init_child(pbVar6,bVar8 + 1,dest);
      bVar4 = leaf(this);
      if (!bVar4) {
        iVar7 = 1;
        while( true ) {
          bVar8 = count(dest);
          if ((uint)bVar8 < iVar7 - 1U) break;
          bVar8 = count(this);
          pbVar6 = child(this,(ulong)((uint)bVar8 + iVar7));
          if (pbVar6 == (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                         *)0x0) {
            __assert_fail("child(count() + i + 1) != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x91a,
                          "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>]"
                         );
          }
          bVar8 = count(this);
          pbVar6 = child(this,(ulong)((uint)bVar8 + iVar7));
          init_child(dest,iVar7 - 1U,pbVar6);
          bVar8 = count(this);
          mutable_child(this,(ulong)((uint)bVar8 + iVar7));
          iVar7 = iVar7 + 1;
        }
      }
      return;
    }
    __assert_fail("count() >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x90a,
                  "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>]"
                 );
  }
  __assert_fail("max_count() == kNodeValues",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x8fc,
                "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }